

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O0

MPP_RET mpp_read_bits(BitReadCtx_t *bitctx,RK_S32 num_bits,RK_S32 *out)

{
  MPP_RET MVar1;
  int local_2c;
  RK_S32 bits_left;
  RK_S32 *out_local;
  RK_S32 num_bits_local;
  BitReadCtx_t *bitctx_local;
  
  *out = 0;
  local_2c = num_bits;
  if (num_bits < 0x20) {
    do {
      if (local_2c <= bitctx->num_remaining_bits_in_curr_byte_) {
        *out = *out | (uint)(bitctx->curr_byte_ >>
                            ((char)bitctx->num_remaining_bits_in_curr_byte_ - (char)local_2c & 0x3fU
                            ));
        *out = (1 << ((byte)num_bits & 0x1f)) - 1U & *out;
        bitctx->num_remaining_bits_in_curr_byte_ =
             bitctx->num_remaining_bits_in_curr_byte_ - local_2c;
        bitctx->used_bits = num_bits + bitctx->used_bits;
        return MPP_OK;
      }
      *out = *out | (uint)(bitctx->curr_byte_ <<
                          ((char)local_2c - (char)bitctx->num_remaining_bits_in_curr_byte_ & 0x3fU))
      ;
      local_2c = local_2c - bitctx->num_remaining_bits_in_curr_byte_;
      MVar1 = (*bitctx->update_curbyte)(bitctx);
    } while (MVar1 == MPP_OK);
  }
  return MPP_ERR_READ_BIT;
}

Assistant:

MPP_RET mpp_read_bits(BitReadCtx_t *bitctx, RK_S32 num_bits, RK_S32 *out)
{
    RK_S32 bits_left = num_bits;
    *out = 0;
    if (num_bits > 31) {
        return  MPP_ERR_READ_BIT;
    }
    while (bitctx->num_remaining_bits_in_curr_byte_ < bits_left) {
        // Take all that's left in current byte, shift to make space for the rest.
        *out |= (bitctx->curr_byte_ << (bits_left - bitctx->num_remaining_bits_in_curr_byte_));
        bits_left -= bitctx->num_remaining_bits_in_curr_byte_;
        if (bitctx->update_curbyte(bitctx)) {
            return  MPP_ERR_READ_BIT;
        }
    }
    *out |= (bitctx->curr_byte_ >> (bitctx->num_remaining_bits_in_curr_byte_ - bits_left));
    *out &= ((1 << num_bits) - 1);
    bitctx->num_remaining_bits_in_curr_byte_ -= bits_left;
    bitctx->used_bits += num_bits;

    return MPP_OK;
}